

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_cargo_zero_or_one_without_arg(void)

{
  int iVar1;
  int local_3c;
  char *pcStack_38;
  int a;
  char *args [2];
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  iVar1 = cargo_init((cargo_t *)(args + 1),0,"program");
  if (iVar1 == 0) {
    pcStack_38 = "program";
    args[0] = "--alpha";
    local_3c = 0;
    iVar1 = cargo_add_option((cargo_t)args[1],0,"--alpha","an option","i?",&local_3c,"5");
    if (iVar1 == 0) {
      iVar1 = cargo_parse((cargo_t)args[1],0,1,2,&stack0xffffffffffffffc8);
      if (iVar1 == 0) {
        if (local_3c != 5) {
          pcStack_18 = "Unexpected value";
        }
      }
      else {
        pcStack_18 = "Failed parse";
      }
    }
    else {
      pcStack_18 = "Failed to add option";
    }
    cargo_destroy((cargo_t *)(args + 1));
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_cargo_zero_or_one_without_arg)
{
    char *args[] = { "program", "--alpha" };
    int a = 0;
    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "i?", &a, "5");
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Failed parse");
    cargo_assert(a == 5, "Unexpected value");

    _TEST_CLEANUP();
}